

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nh_hall.hpp
# Opt level: O3

float __thiscall nh_ugens::VariableAllpass::process(VariableAllpass *this,float in,float offset)

{
  float fVar1;
  int iVar2;
  uint uVar3;
  float *pfVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float c0;
  
  iVar2 = (this->super_BaseDelay).m_read_position;
  fVar7 = (float)(this->super_BaseDelay).m_size +
          ((float)iVar2 -
          (offset + (this->super_BaseDelay).m_delay) * (this->super_BaseDelay).m_sample_rate);
  uVar5 = (uint)fVar7;
  fVar7 = fVar7 - (float)(int)fVar7;
  pfVar4 = (this->super_BaseDelay).m_buffer;
  uVar3 = (this->super_BaseDelay).m_mask;
  fVar8 = pfVar4[(int)(uVar3 & uVar5)];
  fVar6 = pfVar4[(int)(uVar5 + 1 & uVar3)];
  fVar1 = pfVar4[(int)(uVar5 + 2 & uVar3)];
  fVar6 = ((((pfVar4[(int)(uVar5 + 3 & uVar3)] - fVar8) * 0.16666667 + (fVar6 - fVar1) * 0.5) *
            fVar7 + ((fVar8 + fVar1) * 0.5 - fVar6)) * fVar7 +
          pfVar4[(int)(uVar5 + 3 & uVar3)] * -0.16666667 +
          fVar6 * -0.5 + fVar8 * -0.33333334 + fVar1) * fVar7 + fVar6;
  fVar8 = *(float *)&(this->super_BaseDelay).field_0x24 * fVar6 + in;
  pfVar4[iVar2] = fVar8 + 1e-25 + -1e-25;
  (this->super_BaseDelay).m_read_position = iVar2 + 1U & uVar3;
  return fVar6 - fVar8 * *(float *)&(this->super_BaseDelay).field_0x24;
}

Assistant:

float process(float in, float offset) {
        float position = m_read_position - (m_delay + offset) * m_sample_rate;

        // This catches a very sneaky bug -- casting position to int rounds
        // toward zero. To mitigate this, we ensure that the position is always
        // above zero before rounding it down, using the fact that
        // (m_delay + offset) * m_sample_rate < m_size.
        position += m_size;

        int iposition = position;
        float position_frac = position - iposition;

        float y0 = m_buffer[iposition & m_mask];
        float y1 = m_buffer[(iposition + 1) & m_mask];
        float y2 = m_buffer[(iposition + 2) & m_mask];
        float y3 = m_buffer[(iposition + 3) & m_mask];

        float delayed_signal = interpolate_cubic(position_frac, y0, y1, y2, y3);

        float feedback_plus_input = in + delayed_signal * m_k;
        m_buffer[m_read_position] = flush_denormals(feedback_plus_input);
        m_read_position = (m_read_position + 1) & m_mask;
        float out = feedback_plus_input * -m_k + delayed_signal;

        return out;
    }